

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcUnitaryEquipmentType::IfcUnitaryEquipmentType
          (IfcUnitaryEquipmentType *this)

{
  *(undefined ***)&this->field_0x1e0 = &PTR__Object_007fca00;
  *(undefined8 *)&this->field_0x1e8 = 0;
  *(char **)&this->field_0x1f0 = "IfcUnitaryEquipmentType";
  Schema_2x3::IfcEnergyConversionDeviceType::IfcEnergyConversionDeviceType
            (&this->super_IfcEnergyConversionDeviceType,&PTR_construction_vtable_24__008404c8);
  *(undefined8 *)&(this->super_IfcEnergyConversionDeviceType).field_0x1b8 = 0;
  *(undefined8 *)
   &(this->super_IfcEnergyConversionDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject =
       0x840348;
  *(undefined8 *)&this->field_0x1e0 = 0x8404b0;
  *(undefined8 *)
   &(this->super_IfcEnergyConversionDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0x88 = 0x840370;
  (this->super_IfcEnergyConversionDeviceType).super_IfcDistributionFlowElementType.
  super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)0x840398;
  *(undefined8 *)
   &(this->super_IfcEnergyConversionDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0xf0 = 0x8403c0;
  *(undefined8 *)
   &(this->super_IfcEnergyConversionDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.field_0x148 =
       0x8403e8;
  *(undefined8 *)
   &(this->super_IfcEnergyConversionDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.field_0x180 = 0x840410;
  *(undefined8 *)
   &(this->super_IfcEnergyConversionDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.field_0x190 = 0x840438;
  *(undefined8 *)
   &(this->super_IfcEnergyConversionDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.field_0x1a0 = 0x840460;
  *(undefined8 *)
   &(this->super_IfcEnergyConversionDeviceType).super_IfcDistributionFlowElementType.field_0x1b0 =
       0x840488;
  *(undefined1 **)&(this->super_IfcEnergyConversionDeviceType).field_0x1c0 = &this->field_0x1d0;
  *(undefined8 *)&this->field_0x1c8 = 0;
  this->field_0x1d0 = 0;
  return;
}

Assistant:

IfcUnitaryEquipmentType() : Object("IfcUnitaryEquipmentType") {}